

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_path_leaflist_predicate
                 (lyd_node *node,char **buffer,size_t *buflen,size_t *bufused,ly_bool is_static)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  char *pcVar3;
  char local_49;
  LY_ERR ret__;
  char quot;
  char *val;
  size_t len;
  ly_bool is_static_local;
  size_t *bufused_local;
  size_t *buflen_local;
  char **buffer_local;
  lyd_node *node_local;
  
  __s = lyd_get_value(node);
  sVar2 = strlen(__s);
  node_local._4_4_ = lyd_path_str_enlarge(buffer,buflen,*bufused + sVar2 + 6,is_static);
  if (node_local._4_4_ == LY_SUCCESS) {
    local_49 = '\'';
    pcVar3 = strchr(__s,0x27);
    if (pcVar3 != (char *)0x0) {
      local_49 = '\"';
    }
    iVar1 = sprintf(*buffer + *bufused,"[.=%c%s%c]",(ulong)(uint)(int)local_49,__s,
                    (ulong)(uint)(int)local_49);
    *bufused = (long)iVar1 + *bufused;
    node_local._4_4_ = LY_SUCCESS;
  }
  return node_local._4_4_;
}

Assistant:

static LY_ERR
lyd_path_leaflist_predicate(const struct lyd_node *node, char **buffer, size_t *buflen, size_t *bufused, ly_bool is_static)
{
    size_t len;
    const char *val;
    char quot;

    val = lyd_get_value(node);
    len = 4 + strlen(val) + 2; /* "[.='" + val + "']" */
    LY_CHECK_RET(lyd_path_str_enlarge(buffer, buflen, *bufused + len, is_static));

    quot = '\'';
    if (strchr(val, '\'')) {
        quot = '"';
    }
    *bufused += sprintf(*buffer + *bufused, "[.=%c%s%c]", quot, val, quot);

    return LY_SUCCESS;
}